

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O0

void __thiscall
AmstradCPC::ConcreteMachine<false>::flush_output(ConcreteMachine<false> *this,int outputs)

{
  int outputs_local;
  ConcreteMachine<false> *this_local;
  
  if ((outputs & 2U) != 0) {
    AYDeferrer::update(&this->ay_);
    AYDeferrer::flush(&this->ay_);
  }
  flush_fdc(this);
  return;
}

Assistant:

void flush_output(int outputs) final {
			// Just flush the AY.
			if(outputs & Output::Audio) {
				ay_.update();
				ay_.flush();
			}

			// Always flush the FDC.
			flush_fdc();
		}